

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QList<QByteArray> * __thiscall QByteArray::split(QByteArray *this,char sep)

{
  long lVar1;
  QList<QByteArray> *this_00;
  undefined1 in_DL;
  QByteArray *in_RSI;
  QList<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  qsizetype end;
  qsizetype start;
  QList<QByteArray> *list;
  rvalue_ref in_stack_ffffffffffffff68;
  QList<QByteArray> *in_stack_ffffffffffffff70;
  QList<QByteArray> *this_01;
  undefined1 *len;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QList<QByteArray>::QList((QList<QByteArray> *)0x4b5b3d);
  len = (undefined1 *)0x0;
  while (this_00 = (QList<QByteArray> *)
                   indexOf((QByteArray *)this_01,(char)((ulong)in_stack_ffffffffffffff70 >> 0x38),
                           (qsizetype)in_stack_ffffffffffffff68),
        this_00 != (QList<QByteArray> *)0xffffffffffffffff) {
    in_stack_ffffffffffffff70 = this_00;
    mid(in_RSI,CONCAT17(in_DL,CONCAT16(uVar2,in_stack_ffffffffffffffb0)),(qsizetype)len);
    QList<QByteArray>::append(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    ~QByteArray((QByteArray *)0x4b5bbd);
    len = (undefined1 *)((long)&(this_00->d).d + 1);
  }
  mid(in_RSI,CONCAT17(in_DL,CONCAT16(uVar2,in_stack_ffffffffffffffb0)),(qsizetype)len);
  QList<QByteArray>::append(this_00,in_stack_ffffffffffffff68);
  ~QByteArray((QByteArray *)0x4b5c3d);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QByteArray> QByteArray::split(char sep) const
{
    QList<QByteArray> list;
    qsizetype start = 0;
    qsizetype end;
    while ((end = indexOf(sep, start)) != -1) {
        list.append(mid(start, end - start));
        start = end + 1;
    }
    list.append(mid(start));
    return list;
}